

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

TSNode * ts_node__prev_sibling(TSNode *__return_storage_ptr__,TSNode self,_Bool include_anonymous)

{
  TSNode self_00;
  TSNode self_01;
  TSNode self_02;
  undefined1 auVar1 [24];
  TSNode self_03;
  TSNode self_04;
  TSNode self_05;
  TSNode self_06;
  TSNode self_07;
  TSNode self_08;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  Subtree self_09;
  Subtree self_10;
  TSTree *in_stack_fffffffffffffef8;
  undefined1 local_e0 [8];
  NodeChildIterator iterator;
  TSNode child;
  _Bool found_child_containing_target;
  TSTree *pTStack_88;
  _Bool earlier_child_is_relevant;
  TSNode earlier_child;
  TSTree *pTStack_60;
  _Bool earlier_node_is_relevant;
  TSNode earlier_node;
  TSNode node;
  uint32_t target_end_byte;
  _Bool self_is_empty;
  Subtree self_subtree;
  _Bool include_anonymous_local;
  
  auVar1 = self._8_24_;
  self_02.tree = in_stack_fffffffffffffef8;
  self_02.context[0] = auVar1._0_4_;
  self_02.context[1] = auVar1._4_4_;
  self_02.context[2] = auVar1._8_4_;
  self_02.context[3] = auVar1._12_4_;
  self_02.id = (void *)auVar1._16_8_;
  self_09 = ts_node__subtree(self_02);
  uVar6 = ts_subtree_total_bytes(self_09);
  self_03.tree = in_stack_fffffffffffffef8;
  self_03.context[0] = auVar1._0_4_;
  self_03.context[1] = auVar1._4_4_;
  self_03.context[2] = auVar1._8_4_;
  self_03.context[3] = auVar1._12_4_;
  self_03.id = (void *)auVar1._16_8_;
  uVar7 = ts_node_end_byte(self_03);
  self_04.tree = in_stack_fffffffffffffef8;
  self_04.context[0] = auVar1._0_4_;
  self_04.context[1] = auVar1._4_4_;
  self_04.context[2] = auVar1._8_4_;
  self_04.context[3] = auVar1._12_4_;
  self_04.id = (void *)auVar1._16_8_;
  ts_node_parent(self_04);
  ts_node__null();
  bVar3 = false;
  do {
    self_05.context[2] = node.context[2];
    self_05.context[3] = node.context[3];
    self_05.context[0] = node.context[0];
    self_05.context[1] = node.context[1];
    self_05.id = node.id;
    self_05.tree = in_stack_fffffffffffffef8;
    _Var5 = ts_node_is_null(self_05);
    if (((_Var5 ^ 0xffU) & 1) == 0) {
      ts_node__null();
      return __return_storage_ptr__;
    }
    ts_node__null();
    bVar4 = false;
    bVar2 = false;
    ts_node_iterate_children((NodeChildIterator *)local_e0,(TSNode *)&earlier_node.tree);
    while( true ) {
      _Var5 = ts_node_child_iterator_next
                        ((NodeChildIterator *)local_e0,(TSNode *)&iterator.alias_sequence);
      if ((!_Var5) || ((void *)child.context._8_8_ == self.id)) goto LAB_0012a168;
      if (uVar7 < (uint)iterator.tree) {
        bVar2 = true;
        goto LAB_0012a168;
      }
      if ((uint)iterator.tree == uVar7) break;
LAB_0012a082:
      self_00.context._8_8_ = child.context._0_8_;
      self_00.context._0_8_ = iterator.alias_sequence;
      self_00.id = (void *)child.context._8_8_;
      self_00.tree = (TSTree *)child.id;
      _Var5 = ts_node__is_relevant(self_00,include_anonymous);
      if (_Var5) {
        pTStack_88 = (TSTree *)iterator.alias_sequence;
        earlier_child.context._0_8_ = child.context._0_8_;
        earlier_child.context._8_8_ = child.context._8_8_;
        earlier_child.id = child.id;
        bVar4 = true;
      }
      else {
        self_01.context._8_8_ = child.context._0_8_;
        self_01.context._0_8_ = iterator.alias_sequence;
        self_01.id = (void *)child.context._8_8_;
        self_01.tree = (TSTree *)child.id;
        uVar8 = ts_node__relevant_child_count(self_01,include_anonymous);
        if (uVar8 != 0) {
          pTStack_88 = (TSTree *)iterator.alias_sequence;
          earlier_child.context._0_8_ = child.context._0_8_;
          earlier_child.context._8_8_ = child.context._8_8_;
          earlier_child.id = child.id;
          bVar4 = false;
        }
      }
    }
    if (uVar6 == 0) {
      self_06.context._8_8_ = child.context._8_8_;
      self_06.context._0_8_ = child.context._0_8_;
      self_06.id = child.id;
      self_06.tree = in_stack_fffffffffffffef8;
      self_10 = ts_node__subtree(self_06);
      _Var5 = ts_subtree_has_trailing_empty_descendant(self_10,self_09);
      if (!_Var5) goto LAB_0012a082;
    }
    bVar2 = true;
LAB_0012a168:
    if (bVar2) {
      self_07.context[2] = earlier_child.context[2];
      self_07.context[3] = earlier_child.context[3];
      self_07.context[0] = earlier_child.context[0];
      self_07.context[1] = earlier_child.context[1];
      self_07.id = earlier_child.id;
      self_07.tree = in_stack_fffffffffffffef8;
      _Var5 = ts_node_is_null(self_07);
      if (!_Var5) {
        pTStack_60 = pTStack_88;
        earlier_node.context[0] = earlier_child.context[0];
        earlier_node.context[1] = earlier_child.context[1];
        earlier_node.context[2] = earlier_child.context[2];
        earlier_node.context[3] = earlier_child.context[3];
        earlier_node.id = earlier_child.id;
        bVar3 = bVar4;
      }
      earlier_node.tree = (TSTree *)iterator.alias_sequence;
      node.context._0_8_ = child.context._0_8_;
      node.context._8_8_ = child.context._8_8_;
      node.id = child.id;
    }
    else {
      if (bVar4) {
        *(TSTree **)__return_storage_ptr__->context = pTStack_88;
        *(undefined8 *)(__return_storage_ptr__->context + 2) = earlier_child.context._0_8_;
        __return_storage_ptr__->id = (void *)earlier_child.context._8_8_;
        __return_storage_ptr__->tree = (TSTree *)earlier_child.id;
        return __return_storage_ptr__;
      }
      self_08.context[2] = earlier_child.context[2];
      self_08.context[3] = earlier_child.context[3];
      self_08.context[0] = earlier_child.context[0];
      self_08.context[1] = earlier_child.context[1];
      self_08.id = earlier_child.id;
      self_08.tree = in_stack_fffffffffffffef8;
      _Var5 = ts_node_is_null(self_08);
      if (_Var5) {
        if (bVar3) {
          *(TSTree **)__return_storage_ptr__->context = pTStack_60;
          *(undefined8 *)(__return_storage_ptr__->context + 2) = earlier_node.context._0_8_;
          __return_storage_ptr__->id = (void *)earlier_node.context._8_8_;
          __return_storage_ptr__->tree = (TSTree *)earlier_node.id;
          return __return_storage_ptr__;
        }
        earlier_node.tree = pTStack_60;
        node.context[0] = earlier_node.context[0];
        node.context[1] = earlier_node.context[1];
        node.context[2] = earlier_node.context[2];
        node.context[3] = earlier_node.context[3];
        node.id = earlier_node.id;
      }
      else {
        earlier_node.tree = pTStack_88;
        node.context[0] = earlier_child.context[0];
        node.context[1] = earlier_child.context[1];
        node.context[2] = earlier_child.context[2];
        node.context[3] = earlier_child.context[3];
        node.id = earlier_child.id;
      }
    }
  } while( true );
}

Assistant:

static inline TSNode ts_node__prev_sibling(TSNode self, bool include_anonymous) {
  Subtree self_subtree = ts_node__subtree(self);
  bool self_is_empty = ts_subtree_total_bytes(self_subtree) == 0;
  uint32_t target_end_byte = ts_node_end_byte(self);

  TSNode node = ts_node_parent(self);
  TSNode earlier_node = ts_node__null();
  bool earlier_node_is_relevant = false;

  while (!ts_node_is_null(node)) {
    TSNode earlier_child = ts_node__null();
    bool earlier_child_is_relevant = false;
    bool found_child_containing_target = false;

    TSNode child;
    NodeChildIterator iterator = ts_node_iterate_children(&node);
    while (ts_node_child_iterator_next(&iterator, &child)) {
      if (child.id == self.id) break;
      if (iterator.position.bytes > target_end_byte) {
        found_child_containing_target = true;
        break;
      }

      if (iterator.position.bytes == target_end_byte &&
          (!self_is_empty ||
           ts_subtree_has_trailing_empty_descendant(ts_node__subtree(child), self_subtree))) {
        found_child_containing_target = true;
        break;
      }

      if (ts_node__is_relevant(child, include_anonymous)) {
        earlier_child = child;
        earlier_child_is_relevant = true;
      } else if (ts_node__relevant_child_count(child, include_anonymous) > 0) {
        earlier_child = child;
        earlier_child_is_relevant = false;
      }
    }

    if (found_child_containing_target) {
      if (!ts_node_is_null(earlier_child)) {
        earlier_node = earlier_child;
        earlier_node_is_relevant = earlier_child_is_relevant;
      }
      node = child;
    } else if (earlier_child_is_relevant) {
      return earlier_child;
    } else if (!ts_node_is_null(earlier_child)) {
      node = earlier_child;
    } else if (earlier_node_is_relevant) {
      return earlier_node;
    } else {
      node = earlier_node;
    }
  }

  return ts_node__null();
}